

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

bool gguf_read_emplace_helper<std::__cxx11::string>
               (gguf_reader *gr,vector<gguf_kv,_std::allocator<gguf_kv>_> *kv,string *key,
               bool is_array,size_t n)

{
  bool bVar1;
  ssize_t sVar2;
  undefined3 in_register_00000009;
  uint in_register_0000000c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (CONCAT31(in_register_00000009,is_array) == 0) {
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity =
         local_48.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar2 = gguf_reader::read(gr,(int)&local_48,key,(ulong)in_register_0000000c << 0x20);
    if ((char)sVar2 != '\0') {
      std::vector<gguf_kv,std::allocator<gguf_kv>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string&>
                ((vector<gguf_kv,std::allocator<gguf_kv>> *)kv,key,&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((char)sVar2 == '\0') {
      return false;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity = 0;
    bVar1 = gguf_reader::read<std::__cxx11::string>
                      (gr,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_48,n);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      return false;
    }
    std::vector<gguf_kv,std::allocator<gguf_kv>>::
    emplace_back<std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              ((vector<gguf_kv,std::allocator<gguf_kv>> *)kv,key,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
  }
  return true;
}

Assistant:

bool gguf_read_emplace_helper(const struct gguf_reader & gr, std::vector<struct gguf_kv> & kv, const std::string & key, const bool is_array, const size_t n) {
    if (is_array) {
        std::vector<T> value;
        try {
            if (!gr.read(value, n)) {
                return false;
            }
        } catch (std::length_error &) {
            fprintf(stderr, "%s: encountered length_error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        } catch (std::bad_alloc &) {
            fprintf(stderr, "%s: encountered bad_alloc error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        }
        kv.emplace_back(key, value);
    } else {
        T value;
        if (!gr.read(value)) {
            return false;
        }
        kv.emplace_back(key, value);
    }
    return true;
}